

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O0

int acutest_under_debugger_(void)

{
  ssize_t sVar1;
  char *pcVar2;
  ssize_t n;
  char *field;
  pid_t tracer_pid;
  size_t n_read;
  char buf [512];
  int fd;
  int local_214;
  ulong local_210;
  undefined8 local_208 [59];
  undefined8 local_29;
  int local_8;
  
  local_214 = 0;
  local_208[0] = CONCAT71(local_208[0]._1_7_,10);
  local_210 = 1;
  local_8 = open("/proc/self/status",0);
  if (local_8 != -1) {
    while( true ) {
      while ((local_210 < 0x1ff &&
             (sVar1 = read(local_8,(void *)((long)local_208 + local_210),0x1ff - local_210),
             0 < sVar1))) {
        local_210 = sVar1 + local_210;
      }
      *(undefined1 *)((long)local_208 + local_210) = 0;
      pcVar2 = strstr((char *)local_208,"\nTracerPid:");
      if ((pcVar2 != (char *)0x0) && (pcVar2 < (char *)((long)&local_29 + 1))) break;
      if (local_210 != 0x1ff) goto LAB_0010454c;
      local_208[0] = local_29;
      local_210 = 0x20;
    }
    local_214 = atoi(pcVar2 + 0xb);
LAB_0010454c:
    close(local_8);
    if (local_214 != 0) {
      return 1;
    }
  }
  return 0;
}

Assistant:

static int
acutest_under_debugger_(void)
{
#ifdef ACUTEST_LINUX_
    /* Scan /proc/self/status for line "TracerPid: [PID]". If such line exists
     * and the PID is non-zero, we're being debugged. */
    {
        static const int OVERLAP = 32;
        int fd;
        char buf[512];
        size_t n_read;
        pid_t tracer_pid = 0;

        /* Little trick so that we can treat the 1st line the same as any other
         * and detect line start easily. */
        buf[0] = '\n';
        n_read = 1;

        fd = open("/proc/self/status", O_RDONLY);
        if(fd != -1) {
            while(1) {
                static const char pattern[] = "\nTracerPid:";
                const char* field;

                while(n_read < sizeof(buf) - 1) {
                    ssize_t n;

                    n = read(fd, buf + n_read, sizeof(buf) - 1 - n_read);
                    if(n <= 0)
                        break;
                    n_read += (size_t)n;
                }
                buf[n_read] = '\0';

                field = strstr(buf, pattern);
                if(field != NULL  &&  field < buf + sizeof(buf) - OVERLAP) {
                    tracer_pid = (pid_t) atoi(field + sizeof(pattern) - 1);
                    break;
                }

                if(n_read == sizeof(buf) - 1) {
                    /* Move the tail with the potentially incomplete line we're
                     * be looking for to the beginning of the buffer.
                     * (The OVERLAP must be large enough so the searched line
                     * can fit in completely.) */
                    memmove(buf, buf + sizeof(buf) - 1 - OVERLAP, OVERLAP);
                    n_read = OVERLAP;
                } else {
                    break;
                }
            }

            close(fd);

            if(tracer_pid != 0)
                return 1;
        }
    }
#endif

#ifdef ACUTEST_MACOS_
    /* See https://developer.apple.com/library/archive/qa/qa1361/_index.html */
    {
        int mib[4];
        struct kinfo_proc info;
        size_t size;

        mib[0] = CTL_KERN;
        mib[1] = KERN_PROC;
        mib[2] = KERN_PROC_PID;
        mib[3] = getpid();

        size = sizeof(info);
        info.kp_proc.p_flag = 0;
        sysctl(mib, sizeof(mib) / sizeof(*mib), &info, &size, NULL, 0);

        if(info.kp_proc.p_flag & P_TRACED)
            return 1;
    }
#endif

#ifdef ACUTEST_WIN_
    if(IsDebuggerPresent())
        return 1;
#endif

#ifdef RUNNING_ON_VALGRIND
    /* We treat Valgrind as a debugger of sorts.
     * (Macro RUNNING_ON_VALGRIND is provided by <valgrind.h>, if available.) */
    if(RUNNING_ON_VALGRIND)
        return 1;
#endif

    return 0;
}